

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::MultisampleTests::init(MultisampleTests *this,EVP_PKEY_CTX *ctx)

{
  undefined8 in_RAX;
  TestCaseGroup *this_00;
  TestNode *pTVar1;
  CommonEdgeCase *pCVar2;
  MaskProportionalityCase *pMVar3;
  MaskConstancyCase *pMVar4;
  undefined8 extraout_RAX;
  char *description;
  char *name;
  uint uVar5;
  int iVar6;
  
  for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
    uVar5 = (uint)(iVar6 == 2) << 3;
    if (iVar6 == 1) {
      uVar5 = 4;
    }
    this_00 = (TestCaseGroup *)operator_new(0x78);
    name = "default_framebuffer";
    description = "Render into default framebuffer";
    if (iVar6 != 0) {
      name = "fbo_8_samples";
      description = "Render into a framebuffer object with 8 samples";
      if (iVar6 != 2) {
        if (iVar6 == 1) {
          name = "fbo_4_samples";
          description = "Render into a framebuffer object with 4 samples";
        }
        else {
          name = "fbo_max_samples";
          description = "Render into a framebuffer object with the maximum number of samples";
        }
      }
    }
    TestCaseGroup::TestCaseGroup(this_00,(this->super_TestCaseGroup).m_context,name,description);
    uVar5 = -(uint)(iVar6 == 0) | uVar5;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    pTVar1 = (TestNode *)operator_new(0xf8);
    PolygonNumSamplesCase::PolygonNumSamplesCase
              ((PolygonNumSamplesCase *)pTVar1,(this->super_TestCaseGroup).m_context,
               "num_samples_polygon","Test sanity of the sample count, with polygons",uVar5);
    tcu::TestNode::addChild((TestNode *)this_00,pTVar1);
    pTVar1 = (TestNode *)operator_new(0xf8);
    LineNumSamplesCase::LineNumSamplesCase
              ((LineNumSamplesCase *)pTVar1,(this->super_TestCaseGroup).m_context,"num_samples_line"
               ,"Test sanity of the sample count, with lines",uVar5);
    tcu::TestNode::addChild((TestNode *)this_00,pTVar1);
    pCVar2 = (CommonEdgeCase *)operator_new(0xe8);
    CommonEdgeCase::CommonEdgeCase
              (pCVar2,(this->super_TestCaseGroup).m_context,"common_edge_small_quads",
               "Test polygons\' common edges with small quads",CASETYPE_SMALL_QUADS,uVar5);
    tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pCVar2);
    pCVar2 = (CommonEdgeCase *)operator_new(0xe8);
    CommonEdgeCase::CommonEdgeCase
              (pCVar2,(this->super_TestCaseGroup).m_context,"common_edge_big_quad",
               "Test polygons\' common edges with bigger-than-viewport quads",
               CASETYPE_BIGGER_THAN_VIEWPORT_QUAD,uVar5);
    tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pCVar2);
    pCVar2 = (CommonEdgeCase *)operator_new(0xe8);
    CommonEdgeCase::CommonEdgeCase
              (pCVar2,(this->super_TestCaseGroup).m_context,"common_edge_viewport_quad",
               "Test polygons\' common edges with exactly viewport-sized quads",
               CASETYPE_FIT_VIEWPORT_QUAD,uVar5);
    tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pCVar2);
    pTVar1 = (TestNode *)operator_new(0xf8);
    SampleDepthCase::SampleDepthCase
              ((SampleDepthCase *)pTVar1,(this->super_TestCaseGroup).m_context,"depth",
               "Test that depth values are per-sample",uVar5);
    tcu::TestNode::addChild((TestNode *)this_00,pTVar1);
    pTVar1 = (TestNode *)operator_new(0xd8);
    SampleStencilCase::SampleStencilCase
              ((SampleStencilCase *)pTVar1,(this->super_TestCaseGroup).m_context,"stencil",
               "Test that stencil values are per-sample",uVar5);
    tcu::TestNode::addChild((TestNode *)this_00,pTVar1);
    pTVar1 = (TestNode *)operator_new(0xd8);
    CoverageMaskInvertCase::CoverageMaskInvertCase
              ((CoverageMaskInvertCase *)pTVar1,(this->super_TestCaseGroup).m_context,
               "sample_coverage_invert",
               "Test that non-inverted and inverted sample coverage masks are each other\'s negations"
               ,uVar5);
    tcu::TestNode::addChild((TestNode *)this_00,pTVar1);
    pMVar3 = (MaskProportionalityCase *)operator_new(0xe8);
    MaskProportionalityCase::MaskProportionalityCase
              (pMVar3,(this->super_TestCaseGroup).m_context,"proportionality_alpha_to_coverage",
               "Test the proportionality property of GL_SAMPLE_ALPHA_TO_COVERAGE",
               CASETYPE_ALPHA_TO_COVERAGE,uVar5);
    tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pMVar3);
    pMVar3 = (MaskProportionalityCase *)operator_new(0xe8);
    MaskProportionalityCase::MaskProportionalityCase
              (pMVar3,(this->super_TestCaseGroup).m_context,"proportionality_sample_coverage",
               "Test the proportionality property of GL_SAMPLE_COVERAGE",CASETYPE_SAMPLE_COVERAGE,
               uVar5);
    tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pMVar3);
    pMVar3 = (MaskProportionalityCase *)operator_new(0xe8);
    MaskProportionalityCase::MaskProportionalityCase
              (pMVar3,(this->super_TestCaseGroup).m_context,
               "proportionality_sample_coverage_inverted",
               "Test the proportionality property of inverted-mask GL_SAMPLE_COVERAGE",
               CASETYPE_SAMPLE_COVERAGE_INVERTED,uVar5);
    tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pMVar3);
    pMVar4 = (MaskConstancyCase *)operator_new(0xe0);
    MaskConstancyCase::MaskConstancyCase
              (pMVar4,(this->super_TestCaseGroup).m_context,"constancy_alpha_to_coverage",
               "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE"
               ,CASETYPE_ALPHA_TO_COVERAGE,uVar5);
    tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pMVar4);
    pMVar4 = (MaskConstancyCase *)operator_new(0xe0);
    MaskConstancyCase::MaskConstancyCase
              (pMVar4,(this->super_TestCaseGroup).m_context,"constancy_sample_coverage",
               "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_COVERAGE"
               ,CASETYPE_SAMPLE_COVERAGE,uVar5);
    tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pMVar4);
    pMVar4 = (MaskConstancyCase *)operator_new(0xe0);
    MaskConstancyCase::MaskConstancyCase
              (pMVar4,(this->super_TestCaseGroup).m_context,"constancy_sample_coverage_inverted",
               "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using inverted-mask GL_SAMPLE_COVERAGE"
               ,CASETYPE_SAMPLE_COVERAGE_INVERTED,uVar5);
    tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pMVar4);
    pMVar4 = (MaskConstancyCase *)operator_new(0xe0);
    MaskConstancyCase::MaskConstancyCase
              (pMVar4,(this->super_TestCaseGroup).m_context,"constancy_both",
               "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and GL_SAMPLE_COVERAGE"
               ,CASETYPE_BOTH,uVar5);
    tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pMVar4);
    pMVar4 = (MaskConstancyCase *)operator_new(0xe0);
    MaskConstancyCase::MaskConstancyCase
              (pMVar4,(this->super_TestCaseGroup).m_context,"constancy_both_inverted",
               "Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and inverted-mask GL_SAMPLE_COVERAGE"
               ,CASETYPE_BOTH_INVERTED,uVar5);
    tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pMVar4);
    in_RAX = extraout_RAX;
  }
  return (int)in_RAX;
}

Assistant:

void MultisampleTests::init (void)
{
	enum CaseType
	{
		CASETYPE_DEFAULT_FRAMEBUFFER = 0,
		CASETYPE_FBO_4_SAMPLES,
		CASETYPE_FBO_8_SAMPLES,
		CASETYPE_FBO_MAX_SAMPLES,

		CASETYPE_LAST
	};

	for (int caseTypeI = 0; caseTypeI < (int)CASETYPE_LAST; caseTypeI++)
	{
		CaseType		caseType		= (CaseType)caseTypeI;
		int				numFboSamples	= caseType == CASETYPE_DEFAULT_FRAMEBUFFER	? -1
										: caseType == CASETYPE_FBO_4_SAMPLES		? 4
										: caseType == CASETYPE_FBO_8_SAMPLES		? 8
										: caseType == CASETYPE_FBO_MAX_SAMPLES		? 0
										: -2;

		TestCaseGroup*	group			= new TestCaseGroup(m_context,
															caseType == CASETYPE_DEFAULT_FRAMEBUFFER	? "default_framebuffer" :
															caseType == CASETYPE_FBO_4_SAMPLES			? "fbo_4_samples" :
															caseType == CASETYPE_FBO_8_SAMPLES			? "fbo_8_samples" :
															caseType == CASETYPE_FBO_MAX_SAMPLES		? "fbo_max_samples" :
															DE_NULL,
															caseType == CASETYPE_DEFAULT_FRAMEBUFFER	? "Render into default framebuffer" :
															caseType == CASETYPE_FBO_4_SAMPLES			? "Render into a framebuffer object with 4 samples" :
															caseType == CASETYPE_FBO_8_SAMPLES			? "Render into a framebuffer object with 8 samples" :
															caseType == CASETYPE_FBO_MAX_SAMPLES		? "Render into a framebuffer object with the maximum number of samples" :
															DE_NULL);
		DE_ASSERT(group->getName() != DE_NULL);
		DE_ASSERT(group->getDescription() != DE_NULL);
		DE_ASSERT(numFboSamples >= -1);
		addChild(group);

		group->addChild(new PolygonNumSamplesCase		(m_context, "num_samples_polygon",			"Test sanity of the sample count, with polygons",										numFboSamples));
		group->addChild(new LineNumSamplesCase			(m_context, "num_samples_line",				"Test sanity of the sample count, with lines",											numFboSamples));
		group->addChild(new CommonEdgeCase				(m_context, "common_edge_small_quads",		"Test polygons' common edges with small quads",											CommonEdgeCase::CASETYPE_SMALL_QUADS,				numFboSamples));
		group->addChild(new CommonEdgeCase				(m_context, "common_edge_big_quad",			"Test polygons' common edges with bigger-than-viewport quads",							CommonEdgeCase::CASETYPE_BIGGER_THAN_VIEWPORT_QUAD,	numFboSamples));
		group->addChild(new CommonEdgeCase				(m_context, "common_edge_viewport_quad",	"Test polygons' common edges with exactly viewport-sized quads",						CommonEdgeCase::CASETYPE_FIT_VIEWPORT_QUAD,			numFboSamples));
		group->addChild(new SampleDepthCase				(m_context, "depth",						"Test that depth values are per-sample",												numFboSamples));
		group->addChild(new SampleStencilCase			(m_context, "stencil",						"Test that stencil values are per-sample",												numFboSamples));
		group->addChild(new CoverageMaskInvertCase		(m_context, "sample_coverage_invert",		"Test that non-inverted and inverted sample coverage masks are each other's negations",	numFboSamples));

		group->addChild(new MaskProportionalityCase		(m_context, "proportionality_alpha_to_coverage",
																	"Test the proportionality property of GL_SAMPLE_ALPHA_TO_COVERAGE",
																	MaskProportionalityCase::CASETYPE_ALPHA_TO_COVERAGE, numFboSamples));
		group->addChild(new MaskProportionalityCase		(m_context, "proportionality_sample_coverage",
																	"Test the proportionality property of GL_SAMPLE_COVERAGE",
																	MaskProportionalityCase::CASETYPE_SAMPLE_COVERAGE, numFboSamples));
		group->addChild(new MaskProportionalityCase		(m_context, "proportionality_sample_coverage_inverted",
																	"Test the proportionality property of inverted-mask GL_SAMPLE_COVERAGE",
																	MaskProportionalityCase::CASETYPE_SAMPLE_COVERAGE_INVERTED, numFboSamples));

		group->addChild(new MaskConstancyCase			(m_context, "constancy_alpha_to_coverage",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE",
																	MaskConstancyCase::CASETYPE_ALPHA_TO_COVERAGE, numFboSamples));
		group->addChild(new MaskConstancyCase			(m_context, "constancy_sample_coverage",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_COVERAGE",
																	MaskConstancyCase::CASETYPE_SAMPLE_COVERAGE, numFboSamples));
		group->addChild(new MaskConstancyCase			(m_context, "constancy_sample_coverage_inverted",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using inverted-mask GL_SAMPLE_COVERAGE",
																	MaskConstancyCase::CASETYPE_SAMPLE_COVERAGE_INVERTED, numFboSamples));
		group->addChild(new MaskConstancyCase			(m_context, "constancy_both",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and GL_SAMPLE_COVERAGE",
																	MaskConstancyCase::CASETYPE_BOTH, numFboSamples));
		group->addChild(new MaskConstancyCase			(m_context, "constancy_both_inverted",
																	"Test that coverage mask is constant at given coordinates with a given alpha or coverage value, using GL_SAMPLE_ALPHA_TO_COVERAGE and inverted-mask GL_SAMPLE_COVERAGE",
																	MaskConstancyCase::CASETYPE_BOTH_INVERTED, numFboSamples));
	}
}